

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_continue
              (LZ4_streamDecode_t *LZ4_streamDecode,char *source,char *dest,int compressedSize,
              int maxOutputSize)

{
  char *pcVar1;
  ushort *puVar2;
  char cVar3;
  long lVar4;
  unsigned_long_long uVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  void *__src;
  char *pcVar18;
  char *pcVar19;
  ushort *puVar20;
  BYTE *s;
  ulong __n;
  ulong uVar21;
  ulong uVar22;
  int local_88;
  long local_78 [9];
  
  pcVar19 = (char *)LZ4_streamDecode->table[2];
  uVar22 = LZ4_streamDecode->table[3];
  puVar20 = (ushort *)(source + compressedSize);
  pcVar12 = dest + maxOutputSize;
  local_88 = (int)source;
  if (pcVar19 == dest) {
    uVar21 = LZ4_streamDecode->table[1];
    uVar5 = LZ4_streamDecode->table[0];
    local_78[2] = 0;
    local_78[4] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[3] = 0xffffffffffffffff;
    local_78[5] = 1;
    local_78[6] = 2;
    local_78[7] = 3;
    if (maxOutputSize == 0) goto LAB_00156455;
    pcVar19 = pcVar19 + -uVar22;
    pcVar1 = pcVar12 + -8;
    pcVar18 = dest;
LAB_0015612c:
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar11 = (uint)(byte)((byte)uVar6 >> 4);
    sVar13 = (size_t)uVar11;
    if (uVar11 == 0xf) {
      sVar13 = 0xf;
      do {
        uVar7 = *(ushort *)source;
        source = (char *)((long)source + 1);
        sVar13 = sVar13 + (byte)uVar7;
        if ((ushort *)((long)puVar20 - 0xfU) <= source) break;
      } while ((byte)uVar7 == 0xff);
      if ((long)sVar13 < 0) goto LAB_0015641f;
    }
    pcVar17 = pcVar18 + sVar13;
    puVar2 = (ushort *)((long)source + sVar13);
    if ((pcVar17 <= pcVar12 + -0xc) && (puVar2 <= puVar20 + -4)) {
      do {
        *(undefined8 *)pcVar18 = *(undefined8 *)source;
        pcVar18 = pcVar18 + 8;
        source = (char *)((long)source + 8);
      } while (pcVar18 < pcVar17);
      pcVar9 = pcVar17 + -(ulong)*puVar2;
      source = (char *)(puVar2 + 1);
      if ((uVar21 < 0x10000) && (pcVar9 < pcVar19 + -uVar21)) goto LAB_0015641f;
      uVar22 = (ulong)((byte)uVar6 & 0xf);
      if (uVar22 == 0xf) {
        uVar22 = 0xf;
        do {
          if ((ushort *)((long)puVar20 - 5U) < source) goto LAB_0015641f;
          uVar6 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar22 = uVar22 + (byte)uVar6;
        } while ((ulong)(byte)uVar6 == 0xff);
        if ((long)uVar22 < 0) goto LAB_0015641f;
      }
      pcVar16 = pcVar17 + uVar22 + 4;
      pcVar18 = pcVar16;
      if (pcVar9 < pcVar19) {
        if (pcVar12 + -5 < pcVar16) goto LAB_0015641f;
        uVar22 = uVar22 + 4;
        uVar8 = (long)pcVar19 - (long)pcVar9;
        __src = (void *)((uVar5 + uVar21) - uVar8);
        if (uVar22 < uVar8 || uVar22 - uVar8 == 0) {
          memmove(pcVar17,__src,uVar22);
        }
        else {
          local_78[8] = uVar22 - uVar8;
          memcpy(pcVar17,__src,uVar8);
          pcVar18 = pcVar17 + uVar8;
          if ((ulong)((long)pcVar18 - (long)pcVar19) < (ulong)local_78[8]) {
            pcVar17 = pcVar19;
            if ((long)uVar8 < (long)uVar22) {
              do {
                *pcVar18 = *pcVar17;
                pcVar18 = pcVar18 + 1;
                pcVar17 = pcVar17 + 1;
              } while (pcVar18 < pcVar16);
            }
          }
          else {
            memcpy(pcVar18,pcVar19,local_78[8]);
            pcVar18 = pcVar16;
          }
        }
      }
      else {
        lVar14 = (long)pcVar17 - (long)pcVar9;
        if (lVar14 < 8) {
          lVar4 = *(long *)(&DAT_0015b050 + lVar14 * 8);
          pcVar10 = pcVar9 + (lVar4 - local_78[lVar14]);
          *pcVar17 = *pcVar9;
          pcVar17[1] = pcVar9[1];
          pcVar17[2] = pcVar9[2];
          pcVar17[3] = pcVar9[3];
          *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar9 + lVar4);
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar9;
          pcVar10 = pcVar9 + 8;
        }
        pcVar17 = pcVar17 + 8;
        if (pcVar12 + -0xc < pcVar16) {
          if (pcVar12 + -5 < pcVar16) goto LAB_0015641f;
          pcVar9 = pcVar10;
          pcVar15 = pcVar17;
          if (pcVar17 < pcVar1) {
            do {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar9;
              pcVar15 = pcVar15 + 8;
              pcVar9 = pcVar9 + 8;
            } while (pcVar15 < pcVar1);
            pcVar10 = pcVar10 + ((long)pcVar1 - (long)pcVar17);
            pcVar17 = pcVar1;
          }
          for (; pcVar17 < pcVar16; pcVar17 = pcVar17 + 1) {
            cVar3 = *pcVar10;
            pcVar10 = pcVar10 + 1;
            *pcVar17 = cVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pcVar17 = *(undefined8 *)pcVar10;
            pcVar17 = pcVar17 + 8;
            pcVar10 = pcVar10 + 8;
          } while (pcVar17 < pcVar16);
        }
      }
      goto LAB_0015612c;
    }
    if ((puVar2 == puVar20) && (pcVar17 <= pcVar12)) {
      memcpy(pcVar18,source,sVar13);
      uVar11 = (int)pcVar17 - (int)dest;
      goto LAB_00156427;
    }
LAB_0015641f:
    uVar11 = ~(uint)source + local_88;
LAB_00156427:
    if ((int)uVar11 < 1) {
      return uVar11;
    }
    LZ4_streamDecode->table[3] = LZ4_streamDecode->table[3] + (ulong)uVar11;
    pcVar19 = (char *)((ulong)uVar11 + LZ4_streamDecode->table[2]);
  }
  else {
    LZ4_streamDecode->table[1] = uVar22;
    LZ4_streamDecode->table[0] = (long)pcVar19 - uVar22;
    local_78[2] = 0;
    local_78[4] = 0;
    local_78[0] = 0;
    local_78[1] = 0;
    local_78[3] = 0xffffffffffffffff;
    local_78[5] = 1;
    local_78[6] = 2;
    local_78[7] = 3;
    if (maxOutputSize == 0) {
LAB_00156455:
      if (compressedSize != 1) {
        return -1;
      }
      return -(uint)(*source != '\0');
    }
    pcVar1 = pcVar12 + -8;
    pcVar18 = dest;
LAB_00155df7:
    uVar6 = *(ushort *)source;
    source = (char *)((long)source + 1);
    uVar11 = (uint)(byte)((byte)uVar6 >> 4);
    sVar13 = (size_t)uVar11;
    if (uVar11 == 0xf) {
      sVar13 = 0xf;
      do {
        uVar7 = *(ushort *)source;
        source = (char *)((long)source + 1);
        sVar13 = sVar13 + (byte)uVar7;
        if ((ushort *)((long)puVar20 - 0xfU) <= source) break;
      } while ((byte)uVar7 == 0xff);
      if ((long)sVar13 < 0) goto LAB_001563fe;
    }
    pcVar17 = pcVar18 + sVar13;
    puVar2 = (ushort *)((long)source + sVar13);
    if ((pcVar17 <= pcVar12 + -0xc) && (puVar2 <= puVar20 + -4)) {
      do {
        *(undefined8 *)pcVar18 = *(undefined8 *)source;
        pcVar18 = pcVar18 + 8;
        source = (char *)((long)source + 8);
      } while (pcVar18 < pcVar17);
      pcVar9 = pcVar17 + -(ulong)*puVar2;
      source = (char *)(puVar2 + 1);
      if ((uVar22 < 0x10000) && (pcVar9 < dest + -uVar22)) goto LAB_001563fe;
      uVar21 = (ulong)((byte)uVar6 & 0xf);
      if (uVar21 == 0xf) {
        uVar21 = 0xf;
        do {
          if ((ushort *)((long)puVar20 - 5U) < source) goto LAB_001563fe;
          uVar6 = *(ushort *)source;
          source = (char *)((long)source + 1);
          uVar21 = uVar21 + (byte)uVar6;
        } while ((ulong)(byte)uVar6 == 0xff);
        if ((long)uVar21 < 0) goto LAB_001563fe;
      }
      pcVar16 = pcVar17 + uVar21 + 4;
      pcVar18 = pcVar16;
      if (pcVar9 < dest) {
        if (pcVar12 + -5 < pcVar16) goto LAB_001563fe;
        uVar21 = uVar21 + 4;
        __n = (long)dest - (long)pcVar9;
        uVar8 = uVar21 - __n;
        if (uVar21 < __n || uVar8 == 0) {
          memmove(pcVar17,pcVar19 + -__n,uVar21);
        }
        else {
          memcpy(pcVar17,pcVar19 + -__n,__n);
          pcVar18 = pcVar17 + __n;
          if ((ulong)((long)pcVar18 - (long)dest) < uVar8) {
            pcVar17 = dest;
            if ((long)__n < (long)uVar21) {
              do {
                *pcVar18 = *pcVar17;
                pcVar18 = pcVar18 + 1;
                pcVar17 = pcVar17 + 1;
              } while (pcVar18 < pcVar16);
            }
          }
          else {
            memcpy(pcVar18,dest,uVar8);
            pcVar18 = pcVar16;
          }
        }
      }
      else {
        lVar14 = (long)pcVar17 - (long)pcVar9;
        if (lVar14 < 8) {
          lVar4 = *(long *)(&DAT_0015b050 + lVar14 * 8);
          pcVar10 = pcVar9 + (lVar4 - local_78[lVar14]);
          *pcVar17 = *pcVar9;
          pcVar17[1] = pcVar9[1];
          pcVar17[2] = pcVar9[2];
          pcVar17[3] = pcVar9[3];
          *(undefined4 *)(pcVar17 + 4) = *(undefined4 *)(pcVar9 + lVar4);
        }
        else {
          *(undefined8 *)pcVar17 = *(undefined8 *)pcVar9;
          pcVar10 = pcVar9 + 8;
        }
        pcVar17 = pcVar17 + 8;
        if (pcVar12 + -0xc < pcVar16) {
          if (pcVar12 + -5 < pcVar16) goto LAB_001563fe;
          pcVar9 = pcVar10;
          pcVar15 = pcVar17;
          if (pcVar17 < pcVar1) {
            do {
              *(undefined8 *)pcVar15 = *(undefined8 *)pcVar9;
              pcVar15 = pcVar15 + 8;
              pcVar9 = pcVar9 + 8;
            } while (pcVar15 < pcVar1);
            pcVar10 = pcVar10 + ((long)pcVar1 - (long)pcVar17);
            pcVar17 = pcVar1;
          }
          for (; pcVar17 < pcVar16; pcVar17 = pcVar17 + 1) {
            cVar3 = *pcVar10;
            pcVar10 = pcVar10 + 1;
            *pcVar17 = cVar3;
          }
        }
        else {
          do {
            *(undefined8 *)pcVar17 = *(undefined8 *)pcVar10;
            pcVar17 = pcVar17 + 8;
            pcVar10 = pcVar10 + 8;
          } while (pcVar17 < pcVar16);
        }
      }
      goto LAB_00155df7;
    }
    if ((puVar2 == puVar20) && (pcVar17 <= pcVar12)) {
      memcpy(pcVar18,source,sVar13);
      uVar11 = (int)pcVar17 - (int)dest;
      goto LAB_00156406;
    }
LAB_001563fe:
    uVar11 = ~(uint)source + local_88;
LAB_00156406:
    if ((int)uVar11 < 1) {
      return uVar11;
    }
    LZ4_streamDecode->table[3] = (ulong)uVar11;
    pcVar19 = dest + uVar11;
  }
  LZ4_streamDecode->table[2] = (unsigned_long_long)pcVar19;
  return uVar11;
}

Assistant:

int LZ4_decompress_safe_continue (LZ4_streamDecode_t* LZ4_streamDecode, const char* source, char* dest, int compressedSize, int maxOutputSize)
{
    LZ4_streamDecode_t_internal* lz4sd = (LZ4_streamDecode_t_internal*) LZ4_streamDecode;
    int result;

    if (lz4sd->prefixEnd == (BYTE*)dest)
    {
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, lz4sd->prefixEnd - lz4sd->prefixSize, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize += result;
        lz4sd->prefixEnd  += result;
    }
    else
    {
        lz4sd->extDictSize = lz4sd->prefixSize;
        lz4sd->externalDict = lz4sd->prefixEnd - lz4sd->extDictSize;
        result = LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                        endOnInputSize, full, 0,
                                        usingExtDict, (BYTE*)dest, lz4sd->externalDict, lz4sd->extDictSize);
        if (result <= 0) return result;
        lz4sd->prefixSize = result;
        lz4sd->prefixEnd  = (BYTE*)dest + result;
    }

    return result;
}